

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall glslang::HlslGrammar::acceptVectorTemplateType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  int iVar2;
  TType *pTVar3;
  undefined4 extraout_var;
  TConstUnionArray *this_00;
  TConstUnion *this_01;
  TIntermTyped *pTStack_30;
  int vecSizeI;
  TIntermTyped *vecSize;
  TPrecisionQualifier precision;
  TBasicType basicType;
  TType *type_local;
  HlslGrammar *this_local;
  
  _precision = type;
  type_local = (TType *)this;
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokVector);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
    if (bVar1) {
      bVar1 = acceptTemplateVecMatBasicType
                        (this,(TBasicType *)((long)&vecSize + 4),(TPrecisionQualifier *)&vecSize);
      if (bVar1) {
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
        if (bVar1) {
          bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant);
          if (bVar1) {
            bVar1 = acceptLiteral(this,&stack0xffffffffffffffd0);
            if (bVar1) {
              iVar2 = (*(pTStack_30->super_TIntermNode)._vptr_TIntermNode[5])();
              this_00 = TIntermConstantUnion::getConstArray
                                  ((TIntermConstantUnion *)CONCAT44(extraout_var,iVar2));
              this_01 = TConstUnionArray::operator[](this_00,0);
              iVar2 = TConstUnion::getIConst(this_01);
              pTVar3 = (TType *)TType::operator_new(0x98,_precision);
              TType::TType(pTVar3,vecSize._4_4_,EvqTemporary,(TPrecisionQualifier)vecSize,iVar2,0,0,
                           false);
              if (iVar2 == 1) {
                TType::makeVector(_precision);
              }
              bVar1 = HlslTokenStream::acceptTokenClass
                                (&this->super_HlslTokenStream,EHTokRightAngle);
              if (bVar1) {
                this_local._7_1_ = true;
              }
              else {
                expected(this,"right angle bracket");
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            expected(this,"literal integer");
            this_local._7_1_ = false;
          }
        }
        else {
          expected(this,",");
          this_local._7_1_ = false;
        }
      }
      else {
        expected(this,"scalar type");
        this_local._7_1_ = false;
      }
    }
    else {
      pTVar3 = (TType *)TType::operator_new(0x98,_precision);
      TType::TType(pTVar3,EbtFloat,EvqTemporary,4,0,0,false);
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptVectorTemplateType(TType& type)
{
    if (! acceptTokenClass(EHTokVector))
        return false;

    if (! acceptTokenClass(EHTokLeftAngle)) {
        // in HLSL, 'vector' alone means float4.
        new(&type) TType(EbtFloat, EvqTemporary, 4);
        return true;
    }

    TBasicType basicType;
    TPrecisionQualifier precision;
    if (! acceptTemplateVecMatBasicType(basicType, precision)) {
        expected("scalar type");
        return false;
    }

    // COMMA
    if (! acceptTokenClass(EHTokComma)) {
        expected(",");
        return false;
    }

    // integer
    if (! peekTokenClass(EHTokIntConstant)) {
        expected("literal integer");
        return false;
    }

    TIntermTyped* vecSize;
    if (! acceptLiteral(vecSize))
        return false;

    const int vecSizeI = vecSize->getAsConstantUnion()->getConstArray()[0].getIConst();

    new(&type) TType(basicType, EvqTemporary, precision, vecSizeI);

    if (vecSizeI == 1)
        type.makeVector();

    if (!acceptTokenClass(EHTokRightAngle)) {
        expected("right angle bracket");
        return false;
    }

    return true;
}